

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_entities_for_policy.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dc1b7::Json2Array<aliyun::RamListEntitiesForPolicyGroupType>::Json2Array
          (Json2Array<aliyun::RamListEntitiesForPolicyGroupType> *this,Value *value,
          vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_88 [8];
  RamListEntitiesForPolicyGroupType val;
  int i;
  vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RamListEntitiesForPolicyGroupType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.attach_date.field_2._12_4_ = 0; uVar1 = val.attach_date.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.attach_date.field_2._12_4_ = val.attach_date.field_2._12_4_ + 1) {
      aliyun::RamListEntitiesForPolicyGroupType::RamListEntitiesForPolicyGroupType
                ((RamListEntitiesForPolicyGroupType *)local_88);
      value_00 = Json::Value::operator[](value,val.attach_date.field_2._12_4_);
      anon_unknown.dwarf_dc1b7::Json2Type(value_00,(RamListEntitiesForPolicyGroupType *)local_88);
      std::
      vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
      ::push_back(vec,(value_type *)local_88);
      aliyun::RamListEntitiesForPolicyGroupType::~RamListEntitiesForPolicyGroupType
                ((RamListEntitiesForPolicyGroupType *)local_88);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }